

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForcePlatforms.cpp
# Opt level: O0

void __thiscall
ezc3d::Modules::ForcePlatform::extractCalMatrix(ForcePlatform *this,size_t idx,c3d *c3d)

{
  undefined1 uVar1;
  byte bVar2;
  Group *__s;
  Parameter *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  runtime_error *prVar6;
  vector<double,_std::allocator<double>_> *this_01;
  long lVar7;
  const_reference pvVar8;
  double *pdVar9;
  ulong in_RSI;
  long in_RDI;
  size_t j;
  size_t i;
  size_t skip;
  vector<double,_std::allocator<double>_> *val;
  Parameter *calMatrixParam;
  size_t nChannels;
  Group *groupPF;
  string *in_stack_fffffffffffffeb8;
  value_type row;
  Group *in_stack_fffffffffffffec0;
  Matrix *pMVar10;
  string *in_stack_fffffffffffffed0;
  Group *in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  ulong local_d8;
  ulong local_d0;
  undefined1 local_b1 [33];
  Parameter *local_90;
  undefined1 local_81 [33];
  ulong local_60;
  allocator<char> local_41;
  string local_40 [32];
  Group *local_20;
  ulong local_10;
  
  local_10 = in_RSI;
  ezc3d::c3d::parameters((c3d *)0x184009);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  __s = ParametersNS::Parameters::group
                  ((Parameters *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_60 = 0xffffffffffffffff;
  if ((*(long *)(in_RDI + 0x60) != 0) && (*(ulong *)(in_RDI + 0x60) < 5)) {
    local_60 = 6;
  }
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
  local_20 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)__s,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  uVar1 = ParametersNS::GroupNS::Group::isParameter
                    (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  if ((bVar2 & 1) == 0) {
    pMVar10 = (Matrix *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,(char *)__s,
               (allocator<char> *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffef0)));
    this_00 = ParametersNS::GroupNS::Group::parameter
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    local_90 = this_00;
    pvVar3 = ParametersNS::GroupNS::Parameter::dimension(this_00);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar3);
    if (2 < sVar4) {
      pvVar3 = ParametersNS::GroupNS::Parameter::dimension(local_90);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar3,2);
      if (local_10 < *pvVar5) {
        this_01 = ParametersNS::GroupNS::Parameter::valuesAsDouble
                            ((Parameter *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffef0)))
        ;
        sVar4 = std::vector<double,_std::allocator<double>_>::size(this_01);
        if (sVar4 == 0) {
          Matrix::setIdentity(pMVar10);
          return;
        }
        pvVar3 = ParametersNS::GroupNS::Parameter::dimension(local_90);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar3,0);
        pMVar10 = (Matrix *)*pvVar5;
        pvVar3 = ParametersNS::GroupNS::Parameter::dimension(local_90);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar3,1);
        lVar7 = (long)pMVar10 * *pvVar5;
        for (local_d0 = 0; local_d0 < local_60; local_d0 = local_d0 + 1) {
          for (local_d8 = 0; local_d8 < local_60; local_d8 = local_d8 + 1) {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (this_01,lVar7 * local_10 + local_d8 * local_60 + local_d0);
            row = *pvVar8;
            pdVar9 = Matrix::operator()(pMVar10,(size_t)row,0x1844d4);
            *pdVar9 = row;
          }
        }
        return;
      }
    }
    if (((*(long *)(in_RDI + 0x60) != 1) && (*(long *)(in_RDI + 0x60) != 2)) &&
       (*(long *)(in_RDI + 0x60) != 3)) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar6,
                 "FORCE_PLATFORM:CAL_MATRIX is not fill properly to extract Force platform informations"
                );
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_RDI + 0x60) != 2) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar6,
               "FORCE_PLATFORM:CAL_MATRIX was not found, but is required for the type of force platform"
              );
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void ezc3d::Modules::ForcePlatform::extractCalMatrix(size_t idx,
                                                     const ezc3d::c3d &c3d) {
  const ezc3d::ParametersNS::GroupNS::Group &groupPF(
      c3d.parameters().group("FORCE_PLATFORM"));

  size_t nChannels(-1);
  if (_type >= 1 && _type <= 4) {
    nChannels = 6;
  }

  if (!groupPF.isParameter("CAL_MATRIX")) {
    if (_type == 2) {
      // CAL_MATRIX is ignore for type 2
      // If none is found, returns all zeros
      return;
    } else {
      throw std::runtime_error(
          "FORCE_PLATFORM:CAL_MATRIX was not found, but is "
          "required for the type of force platform");
    }
  }

  // Check dimensions
  const auto &calMatrixParam(groupPF.parameter("CAL_MATRIX"));
  if (calMatrixParam.dimension().size() < 3 ||
      calMatrixParam.dimension()[2] <= idx) {
    if (_type == 1 || _type == 2 || _type == 3) {
      // CAL_MATRIX is ignore for type 2
      // If none is found, returns all zeros
      return;
    } else {
      throw std::runtime_error("FORCE_PLATFORM:CAL_MATRIX is not fill properly "
                               "to extract Force platform informations");
    }
  }

  const std::vector<double> &val(calMatrixParam.valuesAsDouble());
  if (val.size() == 0) {
    // This is for Motion Analysis not providing a calibration matrix
    _calMatrix.setIdentity();
  } else {
    size_t skip(calMatrixParam.dimension()[0] * calMatrixParam.dimension()[1]);
    for (size_t i = 0; i < nChannels; ++i) {
      for (size_t j = 0; j < nChannels; ++j) {
        _calMatrix(i, j) = val[skip * idx + j * nChannels + i];
      }
    }
  }
}